

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O1

int ccm_auth_decrypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                    uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  int iVar1;
  uchar local_38 [8];
  uchar check_tag [16];
  
  iVar1 = ccm_auth_crypt(ctx,mode,length,iv,iv_len,add,add_len,input,output,local_38,tag_len);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ct_memcmp(tag,local_38,tag_len);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      iVar1 = -0xf;
    }
  }
  return iVar1;
}

Assistant:

static int ccm_auth_decrypt(mbedtls_ccm_context *ctx, int mode, size_t length,
                            const unsigned char *iv, size_t iv_len,
                            const unsigned char *add, size_t add_len,
                            const unsigned char *input, unsigned char *output,
                            const unsigned char *tag, size_t tag_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];

    if ((ret = ccm_auth_crypt(ctx, mode, length,
                              iv, iv_len, add, add_len,
                              input, output, check_tag, tag_len)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_ccm_compare_tags(tag, check_tag, tag_len)) != 0) {
        mbedtls_platform_zeroize(output, length);
        return ret;
    }

    return 0;
}